

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)141,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  Dn dn;
  byte bVar8;
  uint uVar9;
  uint local_34;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  uVar9 = uVar3 & 0xffff;
  if ((0xfff < uVar9) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)141,(moira::Mode)0,4>(this,str,addr,op);
    return;
  }
  uVar7 = uVar9 >> 6;
  local_34 = uVar7 & 0x1f;
  s = &str->ptr;
  cVar6 = 'b';
  lVar4 = 1;
  do {
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = cVar6;
    cVar6 = "bftst"[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(op & 7));
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar9 = uVar3 & 0x820;
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = ',';
    if (uVar9 < 0x800) {
      if (uVar9 != 0) {
        sprintd_signed(s,(ulong)local_34);
LAB_003623f1:
        pcVar5 = str->ptr;
        str->ptr = pcVar5 + 1;
        *pcVar5 = ',';
        StrWriter::operator<<(str,(Dn)(uVar3 & 7));
        goto LAB_0036240f;
      }
      sprintd_signed(s,(ulong)local_34);
      pcVar5 = *s;
      *s = pcVar5 + 1;
    }
    else {
      if (uVar9 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar7 & 7));
        goto LAB_003623f1;
      }
      StrWriter::operator<<(str,(Dn)(uVar7 & 7));
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
    }
    *pcVar5 = ',';
    sprintd_signed(s,(ulong)(uVar3 & 0x1f));
    goto LAB_0036240f;
  }
  bVar8 = 0x20;
  if ((uVar3 & 0x1f) != 0) {
    bVar8 = (byte)uVar9 & 0x1f;
  }
  uVar3 = uVar3 & 0x820;
  cVar6 = ' ';
  lVar4 = 0;
  if (uVar3 < 0x800) {
    if (uVar3 != 0) {
      do {
        pcVar5 = *s;
        *s = pcVar5 + 1;
        *pcVar5 = cVar6;
        cVar6 = " {"[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 2);
      sprintd_signed(s,(ulong)local_34);
LAB_003623ae:
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar8 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_003623cd;
    }
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = " {"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    sprintd_signed(s,(ulong)local_34);
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = ':';
    sprintd_signed(s,(ulong)bVar8);
    pcVar5 = *s;
    *s = pcVar5 + 1;
  }
  else {
    if (uVar3 != 0x800) {
      do {
        pcVar5 = *s;
        *s = pcVar5 + 1;
        *pcVar5 = cVar6;
        cVar6 = " {"[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 2);
      StrWriter::operator<<(str,(Dn)(uVar7 & 7));
      goto LAB_003623ae;
    }
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = " {"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    StrWriter::operator<<(str,(Dn)(uVar7 & 7));
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ':';
    sprintd_signed(s,(ulong)bVar8);
LAB_003623cd:
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
  }
  *pcVar5 = '}';
LAB_0036240f:
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar6 = ';';
    lVar4 = 1;
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = "trap%-2s  ; (2+)"[lVar4 + 10];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}